

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_wire.cpp
# Opt level: O0

void __thiscall lsim::ModelWire::add_segments(ModelWire *this,Point *anchors,size_t num_anchors)

{
  bool bVar1;
  ulong local_28;
  size_t a;
  size_t num_anchors_local;
  Point *anchors_local;
  ModelWire *this_local;
  
  for (local_28 = 1; local_28 < num_anchors; local_28 = local_28 + 1) {
    bVar1 = lsim::operator!=(anchors + (local_28 - 1),anchors + local_28);
    if (bVar1) {
      add_segment(this,anchors + (local_28 - 1),anchors + local_28);
    }
  }
  return;
}

Assistant:

void ModelWire::add_segments(Point *anchors, size_t num_anchors) {
    for(size_t a = 1;a < num_anchors; ++a) {
        if (anchors[a - 1] != anchors[a]) {
            add_segment(anchors[a - 1], anchors[a]);
        }
    }
}